

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GmmPageTableMgr *this,GMM_UMD_SYNCCONTEXT *UmdContext)

{
  GMM_PAGETABLEPool **ppGVar1;
  GMM_DEVICE_CALLBACKS_INT *pDeviceCb;
  GMM_CLIENT ClientType;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  GmmPageTablePool **ppGVar5;
  GmmClientContext *pClientContext;
  uint64_t uVar6;
  GmmPageTablePool *pGVar7;
  GmmPageTablePool *this_00;
  HANDLE pvVar8;
  SyncInfo BBInfo;
  undefined1 local_88 [8];
  GMM_DEVICE_DEALLOC Dealloc;
  GMM_GFX_SIZE_T local_50;
  GMM_GFX_SIZE_T PoolSizeToFree;
  GmmPageTableMgr *local_40;
  uint local_38;
  GMM_CLIENT local_34;
  
  local_50 = 0;
  if (this->pClientContext == (GmmClientContext *)0x0) {
    local_34 = GMM_UNDEFINED_CLIENT;
  }
  else {
    local_34 = (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
  }
  bVar2 = GmmPageTablePool::__IsUnusedTRTTPoolOverLimit(this->pPool,&local_50);
  if (bVar2) {
    ppGVar1 = &this->pPool;
    pDeviceCb = &this->DeviceCbInt;
    uVar4 = 0;
    pClientContext = (GmmClientContext *)0x0;
    pGVar7 = (GmmPageTablePool *)0x0;
    local_40 = this;
    while ((this = local_40, (uint)pClientContext < local_40->NumNodePoolElements &&
           (uVar4 < local_50))) {
      ppGVar5 = &pGVar7->NextPool;
      if (pGVar7 == (GmmPageTablePool *)0x0) {
        ppGVar5 = ppGVar1;
      }
      if (UmdContext == (GMM_UMD_SYNCCONTEXT *)0x0) {
        pvVar8 = (HANDLE)0x0;
        uVar6 = 0;
      }
      else {
        pvVar8 = UmdContext->BBFenceObj;
        uVar6 = UmdContext->BBLastFence;
      }
      this_00 = *ppGVar5;
      BBInfo.BBFence = uVar6;
      BBInfo.BBQueueHandle = pvVar8;
      PoolSizeToFree = uVar4;
      local_38 = (uint)pClientContext;
      bVar2 = GmmPageTablePool::IsPoolInUse(this_00,BBInfo);
      ClientType = local_34;
      uVar4 = PoolSizeToFree;
      if (!bVar2) {
        iVar3 = GmmCheckForNullDevCbPfn(local_34,pDeviceCb,GMM_DEV_CB_WAIT_FROM_CPU);
        if (iVar3 != 0) {
          Dealloc.hCsr = this_00->PoolHandle;
          GmmDeviceCallback(ClientType,pDeviceCb,
                            (GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU *)&Dealloc.hCsr);
        }
        local_88 = (undefined1  [8])this_00->PoolHandle;
        Dealloc.Handle = (HANDLE)this_00->PoolGfxAddress;
        Dealloc.GfxVA = (GMM_GFX_ADDRESS)this_00->pGmmResInfo;
        Dealloc.Priv = local_40->hCsr;
        __GmmDeviceDealloc(ClientType,pDeviceCb,(GMM_DEVICE_DEALLOC *)local_88,pClientContext);
        ppGVar5 = &pGVar7->NextPool;
        if (pGVar7 == (GmmPageTablePool *)0x0) {
          ppGVar5 = ppGVar1;
        }
        *ppGVar5 = this_00->NextPool;
        GmmPageTablePool::~GmmPageTablePool(this_00);
        operator_delete(this_00);
        uVar4 = PoolSizeToFree + 0x200000;
        this_00 = pGVar7;
      }
      pClientContext = (GmmClientContext *)(ulong)(local_38 + 1);
      pGVar7 = this_00;
    }
  }
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
  }
  return;
}

Assistant:

void GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GMM_UMD_SYNCCONTEXT *UmdContext)
{
    GMM_STATUS                 Status         = GMM_SUCCESS;
    GMM_GFX_SIZE_T             PoolSizeToFree = {0};
    GMM_GFX_SIZE_T             FreedSize      = {0};
    GmmLib::GMM_PAGETABLEPool *Pool = NULL, *PrevPool = NULL;
    uint32_t                   i = 0;
    GMM_CLIENT                 ClientType;
    GMM_DEVICE_DEALLOC         Dealloc;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);

    ENTER_CRITICAL_SECTION
    if(pPool->__IsUnusedTRTTPoolOverLimit(&PoolSizeToFree))
    {
        for(i = 0; i < NumNodePoolElements && FreedSize < PoolSizeToFree; i++)
        {
            Pool = (PrevPool) ? PrevPool->GetNextPool() : pPool;

            if(Pool->IsPoolInUse(UmdContext ? SyncInfo(UmdContext->BBFenceObj, UmdContext->BBLastFence) : SyncInfo()))
            {
                PrevPool = Pool;
                continue;
            }

            if(GmmCheckForNullDevCbPfn(ClientType, &DeviceCbInt, GMM_DEV_CB_WAIT_FROM_CPU))
            {
                GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU Wait = {0};
                Wait.bo                                          = Pool->GetPoolHandle();
                GmmDeviceCallback(ClientType, &DeviceCbInt, &Wait);
            }

            Dealloc.Handle = Pool->GetPoolHandle();
            Dealloc.GfxVA  = Pool->GetGfxAddress();
            Dealloc.Priv   = Pool->GetGmmResInfo();
            Dealloc.hCsr   = hCsr;

            Status = __GmmDeviceDealloc(ClientType, &DeviceCbInt, &Dealloc, pClientContext);

            __GMM_ASSERT(GMM_SUCCESS == Status);

            if(PrevPool)
            {
                PrevPool->GetNextPool() = Pool->GetNextPool();
            }
            else
            {
                pPool = Pool->GetNextPool();
            }
            delete Pool;
            FreedSize += PAGETABLE_POOL_SIZE;
        }
    }
    EXIT_CRITICAL_SECTION
}